

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::
int_writer<long_long,fmt::v5::basic_format_specs<char>>::dec_writer::operator()
          (dec_writer *this,char **it)

{
  char *pcVar1;
  char **it_local;
  dec_writer *this_local;
  
  pcVar1 = internal::format_decimal<char*,unsigned_long>
                     (*it,*(unsigned_long *)this,*(uint *)(this + 8));
  *it = pcVar1;
  return;
}

Assistant:

void operator()(It &&it) const {
        it = internal::format_decimal(it, abs_value, num_digits);
      }